

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

void Gia_ManPrintDivStats(Gia_Man_t *p,Vec_Wec_t *vMffcs,Vec_Wec_t *vPivots)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p_00;
  uint uVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  
  iVar6 = 0;
  uVar5 = 0;
  for (iVar7 = 0; uVar1 = vMffcs->nSize, iVar7 < (int)uVar1; iVar7 = iVar7 + 1) {
    p_00 = Vec_WecEntry(vMffcs,iVar7);
    iVar4 = p_00->nSize;
    iVar2 = Vec_IntEntry(p_00,1);
    iVar3 = Vec_IntEntry(p_00,2);
    iVar6 = (iVar6 + iVar4 + -3) - (iVar3 + iVar2);
    uVar5 = uVar5 + (iVar4 + -3 == iVar3 + iVar2);
  }
  iVar4 = Gia_ManAndNum(p);
  iVar7 = 1;
  if (1 < (int)(uVar1 - uVar5)) {
    iVar7 = uVar1 - uVar5;
  }
  printf("Collected %d (%.1f %%) MFFCs and %d (%.1f %%) have no divisors (div ave for others is %.2f).\n"
         ,((double)(int)uVar1 * 100.0) / (double)iVar4,((double)(int)uVar5 * 100.0) / (double)iVar4,
         (double)iVar6 / (double)iVar7,(ulong)uVar1,(ulong)uVar5);
  dVar8 = Vec_WecMemory(vMffcs);
  dVar9 = Vec_WecMemory(vPivots);
  printf("Using %.2f MB for MFFCs and %.2f MB for pivots.   ",dVar8 * 9.5367431640625e-07,
         dVar9 * 9.5367431640625e-07);
  return;
}

Assistant:

void Gia_ManPrintDivStats( Gia_Man_t * p, Vec_Wec_t * vMffcs, Vec_Wec_t * vPivots ) 
{
    int fVerbose = 0;
    Vec_Int_t * vMffc;
    int i, nDivs, nDivsAll = 0, nDivs0 = 0;
    Vec_WecForEachLevel( vMffcs, vMffc, i )
    {
        nDivs = Vec_IntSize(vMffc) - 3 - Vec_IntEntry(vMffc, 1) - Vec_IntEntry(vMffc, 2);
        nDivs0 += (nDivs == 0);
        nDivsAll += nDivs;
        if ( !fVerbose )
            continue;
        printf( "%6d : ",      Vec_IntEntry(vMffc, 0) );
        printf( "Leaf =%3d  ", Vec_IntEntry(vMffc, 1) );
        printf( "Mffc =%4d  ", Vec_IntEntry(vMffc, 2) );
        printf( "Divs =%4d  ", nDivs );
        printf( "\n" );
    }
    printf( "Collected %d (%.1f %%) MFFCs and %d (%.1f %%) have no divisors (div ave for others is %.2f).\n", 
        Vec_WecSize(vMffcs), 100.0 * Vec_WecSize(vMffcs) / Gia_ManAndNum(p), 
        nDivs0, 100.0 * nDivs0 / Gia_ManAndNum(p), 
        1.0*nDivsAll/Abc_MaxInt(1, Vec_WecSize(vMffcs) - nDivs0) );
    printf( "Using %.2f MB for MFFCs and %.2f MB for pivots.   ", 
        Vec_WecMemory(vMffcs)/(1<<20), Vec_WecMemory(vPivots)/(1<<20) );
}